

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O3

bool __thiscall
MinVR::VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1>::pop
          (VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1> *this)

{
  size_t *psVar1;
  int iVar2;
  _List_node_base *p_Var3;
  int iVar4;
  
  iVar2 = this->stackFrame;
  iVar4 = iVar2 + -1;
  this->stackFrame = iVar4;
  if ((1 < iVar2 & this->pushed) == 1) {
    p_Var3 = (this->value).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
             super__List_node_base._M_next;
    psVar1 = &(this->value).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x18);
    std::__cxx11::
    list<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::_M_erase(&(this->super_VRDatum).attrList,
               (this->super_VRDatum).attrList.
               super__List_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next);
    this->pushed = false;
    iVar4 = this->stackFrame;
  }
  return iVar4 < 1;
}

Assistant:

bool pop() {
    stackFrame--;
    if (pushed && (stackFrame > 0)) {
      value.pop_front();
      attrList.pop_front();
      pushed = false;
    };
    // A value with a stackFrame zero or less should be cleaned up.
    // It would have been added to the data index in a context that no
    // longer exists.  Use the return value from this function to
    // indicate a datum should be cleaned up.
    return (stackFrame <= 0);
  }